

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

string * __thiscall
google::GetCapturedTestOutput_abi_cxx11_(string *__return_storage_ptr__,google *this,int fd)

{
  CapturedStream *pCVar1;
  ostream *poVar2;
  char *__filename;
  FILE *__stream;
  FILE *file_00;
  FILE *file;
  LogMessage local_60;
  LogMessageVoidify local_49;
  CapturedStream *local_48;
  CapturedStream *cap;
  byte local_29;
  LogMessage local_28;
  LogMessageVoidify local_15;
  int local_14;
  string *psStack_10;
  int fd_local;
  string *content;
  
  local_14 = (int)this;
  local_29 = 0;
  psStack_10 = __return_storage_ptr__;
  if (local_14 != 1 && local_14 != 2) {
    LogMessageVoidify::LogMessageVoidify(&local_15);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x16d);
    local_29 = 1;
    poVar2 = LogMessage::stream(&local_28);
    poVar2 = std::operator<<(poVar2,"Check failed: fd == STDOUT_FILENO || fd == STDERR_FILENO ");
    LogMessageVoidify::operator&(&local_15,poVar2);
  }
  if ((local_29 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
  }
  local_48 = *(CapturedStream **)(s_captured_streams + (long)local_14 * 8);
  if (local_48 != (CapturedStream *)0x0) {
    CapturedStream::StopCapture(local_48);
    CapturedStream::filename_abi_cxx11_(local_48);
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    ReadEntireFile_abi_cxx11_(__return_storage_ptr__,(google *)__stream,file_00);
    fclose(__stream);
    pCVar1 = local_48;
    if (local_48 != (CapturedStream *)0x0) {
      CapturedStream::~CapturedStream(local_48);
      operator_delete(pCVar1,0x28);
    }
    *(undefined8 *)(s_captured_streams + (long)local_14 * 8) = 0;
    return __return_storage_ptr__;
  }
  LogMessageVoidify::LogMessageVoidify(&local_49);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x16f);
  poVar2 = LogMessage::stream(&local_60);
  poVar2 = std::operator<<(poVar2,"Check failed: cap ");
  poVar2 = std::operator<<(poVar2,": did you forget CaptureTestStdout() or CaptureTestStderr()?");
  LogMessageVoidify::operator&(&local_49,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

static inline string GetCapturedTestOutput(int fd) {
  CHECK(fd == STDOUT_FILENO || fd == STDERR_FILENO);
  CapturedStream * const cap = s_captured_streams[fd];
  CHECK(cap)
    << ": did you forget CaptureTestStdout() or CaptureTestStderr()?";

  // Make sure everything is flushed.
  cap->StopCapture();

  // Read the captured file.
  FILE * const file = fopen(cap->filename().c_str(), "r");
  const string content = ReadEntireFile(file);
  fclose(file);

  delete cap;
  s_captured_streams[fd] = NULL;

  return content;
}